

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzMulMod(word *c,word *a,word *b,word *mod,size_t n,void *stack)

{
  void *stack_00;
  
  stack_00 = (void *)(n * 0x10 + (long)stack);
  zzMul((word *)stack,a,n,b,n,stack_00);
  zzMod(c,(word *)stack,n * 2,mod,n,stack_00);
  return;
}

Assistant:

void zzMulMod(word c[], const word a[], const word b[], const word mod[],
	size_t n, void* stack)
{
	word* prod = (word*)stack;
	stack = prod + 2 * n;
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwCmp(b, mod, n) < 0);
	ASSERT(wwIsValid(c, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	zzMul(prod, a, n, b, n, stack);
	zzMod(c, prod, 2 * n, mod, n, stack);
}